

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_42055d::Db::parseOperatorName(Db *this,NameState *State)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  Node *pNVar7;
  Node *pNVar8;
  NameType *pNVar9;
  undefined **ppuVar10;
  ulong uVar11;
  char *pcVar12;
  
  pbVar4 = (byte *)this->First;
  uVar11 = (long)this->Last - (long)pbVar4;
  if ((byte *)this->Last == pbVar4) {
    uVar6 = 0;
  }
  else {
    uVar6 = (uint)*pbVar4;
  }
  if (0x15 < uVar6 - 0x61) {
    return (Node *)0x0;
  }
  uVar3 = (&switchD_0019ee27::switchdataD_001be134)[uVar6 - 0x61];
  switch(uVar6) {
  case 0x61:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    if (bVar5 < 0x61) {
      if (bVar5 != 0x4e) {
        if (bVar5 != 0x53) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator=";
        goto LAB_0019f591;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator&=";
    }
    else {
      if ((bVar5 == 0x6e) || (bVar5 == 100)) {
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator&";
        goto LAB_0019f591;
      }
      if (bVar5 != 0x61) {
        return (Node *)0x0;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator&&";
    }
    break;
  default:
    goto switchD_0019ee27_caseD_62;
  case 99:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    if (bVar5 < 0x6f) {
      if (bVar5 == 0x6c) {
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator()";
        break;
      }
      if (bVar5 != 0x6d) {
        return (Node *)0x0;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator,";
    }
    else {
      if (bVar5 != 0x6f) {
        if (bVar5 != 0x76) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        bVar1 = this->TryToParseTemplateArgs;
        bVar2 = this->PermitForwardTemplateReferences;
        this->TryToParseTemplateArgs = false;
        this->PermitForwardTemplateReferences = (bool)(State != (NameState *)0x0 | bVar2);
        pNVar7 = parseType(this);
        if (pNVar7 == (Node *)0x0) {
          pNVar8 = (Node *)0x0;
        }
        else {
          if (State != (NameState *)0x0) {
            State->CtorDtorConversion = true;
          }
          pNVar8 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
          pNVar8->K = KConversionOperatorType;
          pNVar8->RHSComponentCache = No;
          pNVar8->ArrayCache = No;
          pNVar8->FunctionCache = No;
          pNVar8->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eade8;
          pNVar8[1]._vptr_Node = (_func_int **)pNVar7;
        }
        this->PermitForwardTemplateReferences = bVar2;
        this->TryToParseTemplateArgs = bVar1;
        return pNVar8;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator~";
    }
    goto LAB_0019f591;
  case 100:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    if (bVar5 < 0x65) {
      if (bVar5 != 0x56) {
        if (bVar5 != 0x61) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[18]>
                           ((Db *)this,(char (*) [18])"operator delete[]");
        return &pNVar9->super_Node;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator/=";
      break;
    }
    if (bVar5 != 0x65) {
      if (bVar5 == 0x6c) {
        this->First = (char *)(pbVar4 + 2);
        pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar7->K = KNameType;
        pNVar7->RHSComponentCache = No;
        pNVar7->ArrayCache = No;
        pNVar7->FunctionCache = No;
        pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001ea708;
        pNVar7[1]._vptr_Node = (_func_int **)"operator delete";
        *(char **)&pNVar7[1].K = "";
        return pNVar7;
      }
      if (bVar5 != 0x76) {
        return (Node *)0x0;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator/";
      goto LAB_0019f591;
    }
    goto LAB_0019f386;
  case 0x65:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    if (bVar5 == 0x4f) {
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator^=";
    }
    else {
      if (bVar5 != 0x71) {
        if (bVar5 != 0x6f) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator^";
        goto LAB_0019f591;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator==";
    }
    break;
  case 0x67:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    if (bVar5 == 0x74) {
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator>";
      goto LAB_0019f591;
    }
    if (bVar5 != 0x65) {
      return (Node *)0x0;
    }
    this->First = (char *)(pbVar4 + 2);
    pcVar12 = "operator>=";
    break;
  case 0x69:
    if (uVar11 < 2) {
      return (Node *)0x0;
    }
    if (pbVar4[1] != 0x78) {
      return (Node *)0x0;
    }
    this->First = (char *)(pbVar4 + 2);
    pcVar12 = "operator[]";
    break;
  case 0x6c:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    if (bVar5 < 0x69) {
      if (bVar5 == 0x53) {
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator<<=";
        goto LAB_0019f5dd;
      }
      if (bVar5 != 0x65) {
        return (Node *)0x0;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator<=";
    }
    else {
      if (bVar5 == 0x69) {
        this->First = (char *)(pbVar4 + 2);
        pNVar7 = parseSourceName(this,(NameState *)
                                      ((long)&switchD_0019ee27::switchdataD_001be134 +
                                      (long)(int)uVar3));
        if (pNVar7 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pNVar8 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
        pNVar8->K = KLiteralOperator;
        pNVar8->RHSComponentCache = No;
        pNVar8->ArrayCache = No;
        pNVar8->FunctionCache = No;
        ppuVar10 = &PTR_hasRHSComponentSlow_001eae40;
LAB_0019f516:
        pNVar8->_vptr_Node = (_func_int **)ppuVar10;
        pNVar8[1]._vptr_Node = (_func_int **)pNVar7;
        return pNVar8;
      }
      if (bVar5 != 0x73) {
        if (bVar5 != 0x74) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator<";
        goto LAB_0019f591;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator<<";
    }
    break;
  case 0x6d:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    if (bVar5 < 0x69) {
      if (bVar5 == 0x49) {
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator-=";
      }
      else {
        if (bVar5 != 0x4c) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator*=";
      }
      break;
    }
    if (bVar5 == 0x6d) {
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator--";
      break;
    }
    if (bVar5 != 0x6c) {
      if (bVar5 != 0x69) {
        return (Node *)0x0;
      }
      goto LAB_0019f3ac;
    }
LAB_0019f386:
    this->First = (char *)(pbVar4 + 2);
    pcVar12 = "operator*";
    goto LAB_0019f591;
  case 0x6e:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    if (bVar5 < 0x67) {
      if (bVar5 == 0x61) {
        this->First = (char *)(pbVar4 + 2);
        pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[15]>
                           ((Db *)this,(char (*) [15])"operator new[]");
        return &pNVar9->super_Node;
      }
      if (bVar5 != 0x65) {
        return (Node *)0x0;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator!=";
      break;
    }
    if (bVar5 != 0x67) {
      if (bVar5 != 0x74) {
        if (bVar5 != 0x77) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[13]>
                           ((Db *)this,(char (*) [13])"operator new");
        return &pNVar9->super_Node;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator!";
      goto LAB_0019f591;
    }
LAB_0019f3ac:
    this->First = (char *)(pbVar4 + 2);
    pcVar12 = "operator-";
    goto LAB_0019f591;
  case 0x6f:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    if (bVar5 == 0x52) {
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator|=";
    }
    else {
      if (bVar5 == 0x72) {
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator|";
        goto LAB_0019f591;
      }
      if (bVar5 != 0x6f) {
        return (Node *)0x0;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator||";
    }
    break;
  case 0x70:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    switch(bVar5) {
    case 0x6c:
    case 0x73:
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator+";
      goto LAB_0019f591;
    case 0x6d:
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator->*";
      goto LAB_0019f5dd;
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
      goto switchD_0019ee27_caseD_62;
    case 0x70:
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator++";
      break;
    case 0x74:
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator->";
      break;
    default:
      if (bVar5 != 0x4c) {
        return (Node *)0x0;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator+=";
    }
    break;
  case 0x71:
    if (uVar11 < 2) {
      return (Node *)0x0;
    }
    if (pbVar4[1] != 0x75) {
      return (Node *)0x0;
    }
    this->First = (char *)(pbVar4 + 2);
    pcVar12 = "operator?";
LAB_0019f591:
    pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[10]>
                       ((Db *)this,(char (*) [10])pcVar12);
    return &pNVar9->super_Node;
  case 0x72:
    if (uVar11 < 2) {
      bVar5 = 0;
    }
    else {
      bVar5 = pbVar4[1];
    }
    if (bVar5 < 0x6d) {
      if (bVar5 != 0x4d) {
        if (bVar5 != 0x53) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator>>=";
        goto LAB_0019f5dd;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator%=";
    }
    else {
      if (bVar5 != 0x73) {
        if (bVar5 != 0x6d) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar12 = "operator%";
        goto LAB_0019f591;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar12 = "operator>>";
    }
    break;
  case 0x73:
    if (uVar11 < 2) {
      return (Node *)0x0;
    }
    if (pbVar4[1] != 0x73) {
      return (Node *)0x0;
    }
    this->First = (char *)(pbVar4 + 2);
    pcVar12 = "operator<=>";
LAB_0019f5dd:
    pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[12]>
                       ((Db *)this,(char (*) [12])pcVar12);
    return &pNVar9->super_Node;
  case 0x76:
    if ((1 < uVar11) && ((int)(char)pbVar4[1] - 0x30U < 10)) {
      this->First = (char *)(pbVar4 + 2);
      pNVar7 = parseSourceName(this,(NameState *)
                                    ((long)&switchD_0019ee27::switchdataD_001be134 +
                                    (long)(int)uVar3));
      if (pNVar7 != (Node *)0x0) {
        pNVar8 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
        pNVar8->K = KConversionOperatorType;
        pNVar8->RHSComponentCache = No;
        pNVar8->ArrayCache = No;
        pNVar8->FunctionCache = No;
        ppuVar10 = &PTR_hasRHSComponentSlow_001eade8;
        goto LAB_0019f516;
      }
    }
    goto switchD_0019ee27_caseD_62;
  }
  pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[11]>
                     ((Db *)this,(char (*) [11])pcVar12);
  return &pNVar9->super_Node;
switchD_0019ee27_caseD_62:
  return (Node *)0x0;
}

Assistant:

Node *Db::parseOperatorName(NameState *State) {
  switch (look()) {
  case 'a':
    switch (look(1)) {
    case 'a':
      First += 2;
      return make<NameType>("operator&&");
    case 'd':
    case 'n':
      First += 2;
      return make<NameType>("operator&");
    case 'N':
      First += 2;
      return make<NameType>("operator&=");
    case 'S':
      First += 2;
      return make<NameType>("operator=");
    }
    return nullptr;
  case 'c':
    switch (look(1)) {
    case 'l':
      First += 2;
      return make<NameType>("operator()");
    case 'm':
      First += 2;
      return make<NameType>("operator,");
    case 'o':
      First += 2;
      return make<NameType>("operator~");
    //                   ::= cv <type>    # (cast)
    case 'v': {
      First += 2;
      SwapAndRestore<bool> SaveTemplate(TryToParseTemplateArgs, false);
      // If we're parsing an encoding, State != nullptr and the conversion
      // operators' <type> could have a <template-param> that refers to some
      // <template-arg>s further ahead in the mangled name.
      SwapAndRestore<bool> SavePermit(PermitForwardTemplateReferences,
                                      PermitForwardTemplateReferences ||
                                          State != nullptr);
      Node* Ty = parseType();
      if (Ty == nullptr)
        return nullptr;
      if (State) State->CtorDtorConversion = true;
      return make<ConversionOperatorType>(Ty);
    }
    }
    return nullptr;
  case 'd':
    switch (look(1)) {
    case 'a':
      First += 2;
      return make<NameType>("operator delete[]");
    case 'e':
      First += 2;
      return make<NameType>("operator*");
    case 'l':
      First += 2;
      return make<NameType>("operator delete");
    case 'v':
      First += 2;
      return make<NameType>("operator/");
    case 'V':
      First += 2;
      return make<NameType>("operator/=");
    }
    return nullptr;
  case 'e':
    switch (look(1)) {
    case 'o':
      First += 2;
      return make<NameType>("operator^");
    case 'O':
      First += 2;
      return make<NameType>("operator^=");
    case 'q':
      First += 2;
      return make<NameType>("operator==");
    }
    return nullptr;
  case 'g':
    switch (look(1)) {
    case 'e':
      First += 2;
      return make<NameType>("operator>=");
    case 't':
      First += 2;
      return make<NameType>("operator>");
    }
    return nullptr;
  case 'i':
    if (look(1) == 'x') {
      First += 2;
      return make<NameType>("operator[]");
    }
    return nullptr;
  case 'l':
    switch (look(1)) {
    case 'e':
      First += 2;
      return make<NameType>("operator<=");
    //                   ::= li <source-name>  # operator ""
    case 'i': {
      First += 2;
      Node *SN = parseSourceName(State);
      if (SN == nullptr)
        return nullptr;
      return make<LiteralOperator>(SN);
    }
    case 's':
      First += 2;
      return make<NameType>("operator<<");
    case 'S':
      First += 2;
      return make<NameType>("operator<<=");
    case 't':
      First += 2;
      return make<NameType>("operator<");
    }
    return nullptr;
  case 'm':
    switch (look(1)) {
    case 'i':
      First += 2;
      return make<NameType>("operator-");
    case 'I':
      First += 2;
      return make<NameType>("operator-=");
    case 'l':
      First += 2;
      return make<NameType>("operator*");
    case 'L':
      First += 2;
      return make<NameType>("operator*=");
    case 'm':
      First += 2;
      return make<NameType>("operator--");
    }
    return nullptr;
  case 'n':
    switch (look(1)) {
    case 'a':
      First += 2;
      return make<NameType>("operator new[]");
    case 'e':
      First += 2;
      return make<NameType>("operator!=");
    case 'g':
      First += 2;
      return make<NameType>("operator-");
    case 't':
      First += 2;
      return make<NameType>("operator!");
    case 'w':
      First += 2;
      return make<NameType>("operator new");
    }
    return nullptr;
  case 'o':
    switch (look(1)) {
    case 'o':
      First += 2;
      return make<NameType>("operator||");
    case 'r':
      First += 2;
      return make<NameType>("operator|");
    case 'R':
      First += 2;
      return make<NameType>("operator|=");
    }
    return nullptr;
  case 'p':
    switch (look(1)) {
    case 'm':
      First += 2;
      return make<NameType>("operator->*");
    case 'l':
      First += 2;
      return make<NameType>("operator+");
    case 'L':
      First += 2;
      return make<NameType>("operator+=");
    case 'p':
      First += 2;
      return make<NameType>("operator++");
    case 's':
      First += 2;
      return make<NameType>("operator+");
    case 't':
      First += 2;
      return make<NameType>("operator->");
    }
    return nullptr;
  case 'q':
    if (look(1) == 'u') {
      First += 2;
      return make<NameType>("operator?");
    }
    return nullptr;
  case 'r':
    switch (look(1)) {
    case 'm':
      First += 2;
      return make<NameType>("operator%");
    case 'M':
      First += 2;
      return make<NameType>("operator%=");
    case 's':
      First += 2;
      return make<NameType>("operator>>");
    case 'S':
      First += 2;
      return make<NameType>("operator>>=");
    }
    return nullptr;
  case 's':
    if (look(1) == 's') {
      First += 2;
      return make<NameType>("operator<=>");
    }
    return nullptr;
  // ::= v <digit> <source-name>        # vendor extended operator
  case 'v':
    if (std::isdigit(look(1))) {
      First += 2;
      Node *SN = parseSourceName(State);
      if (SN == nullptr)
        return nullptr;
      return make<ConversionOperatorType>(SN);
    }
    return nullptr;
  }
  return nullptr;
}